

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGTextElement::boundingBox(SVGTextElement *this,bool includeStroke)

{
  float fVar1;
  float w;
  Rect RVar2;
  bool bVar3;
  reference pSVar4;
  Font *this_00;
  float fVar5;
  float h;
  float fVar6;
  Rect local_a8;
  undefined1 local_98 [8];
  Rect fragmentRect;
  undefined1 local_70 [8];
  Transform fragmentTranform;
  SVGPaintServer *stroke;
  Font *font;
  SVGTextFragment *fragment;
  const_iterator __end1;
  const_iterator __begin1;
  SVGTextFragmentList *__range1;
  bool includeStroke_local;
  SVGTextElement *this_local;
  Rect boundingBox;
  
  this_local = (SVGTextElement *)0x0;
  boundingBox.x = -1.0;
  boundingBox.y = -1.0;
  __end1 = std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::begin
                     (&this->m_fragments);
  fragment = (SVGTextFragment *)
             std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::end
                       (&this->m_fragments);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                     *)&fragment), bVar3) {
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
             ::operator*(&__end1);
    this_00 = SVGTextPositioningElement::font(pSVar4->element);
    fragmentTranform.m_matrix._16_8_ = SVGTextPositioningElement::stroke(pSVar4->element);
    Transform::rotated((Transform *)&fragmentRect.w,pSVar4->angle,pSVar4->x,pSVar4->y);
    Transform::operator*
              ((Transform *)local_70,(Transform *)&fragmentRect.w,&pSVar4->lengthAdjustTransform);
    fVar6 = pSVar4->x;
    fVar1 = pSVar4->y;
    fVar5 = Font::ascent(this_00);
    w = pSVar4->width;
    h = SVGElement::font_size((SVGElement *)pSVar4->element);
    Rect::Rect((Rect *)local_98,fVar6,fVar1 - fVar5,w,h);
    if ((includeStroke) &&
       (bVar3 = SVGPaintServer::isRenderable((SVGPaintServer *)fragmentTranform.m_matrix._16_8_),
       bVar3)) {
      fVar6 = SVGTextPositioningElement::stroke_width(pSVar4->element);
      Rect::inflate((Rect *)local_98,fVar6 / 2.0);
    }
    local_a8 = Transform::mapRect((Transform *)local_70,(Rect *)local_98);
    Rect::unite((Rect *)&this_local,&local_a8);
    __gnu_cxx::
    __normal_iterator<const_lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
    ::operator++(&__end1);
  }
  bVar3 = Rect::isValid((Rect *)&this_local);
  if (!bVar3) {
    this_local = (SVGTextElement *)0x0;
    boundingBox.x = 0.0;
    boundingBox.y = 0.0;
  }
  RVar2.w = boundingBox.x;
  RVar2.h = boundingBox.y;
  RVar2._0_8_ = this_local;
  return RVar2;
}

Assistant:

Rect SVGTextElement::boundingBox(bool includeStroke) const
{
    auto boundingBox = Rect::Invalid;
    for(const auto& fragment : m_fragments) {
        const auto& font = fragment.element->font();
        const auto& stroke = fragment.element->stroke();
        auto fragmentTranform = Transform::rotated(fragment.angle, fragment.x, fragment.y) * fragment.lengthAdjustTransform;
        auto fragmentRect = Rect(fragment.x, fragment.y - font.ascent(), fragment.width, fragment.element->font_size());
        if(includeStroke && stroke.isRenderable())
            fragmentRect.inflate(fragment.element->stroke_width() / 2.f);
        boundingBox.unite(fragmentTranform.mapRect(fragmentRect));
    }

    if(!boundingBox.isValid())
        boundingBox = Rect::Empty;
    return boundingBox;
}